

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O2

uint8_t * __thiscall
MPEGPictureHeader::deserialize(MPEGPictureHeader *this,uint8_t *buf,int64_t buf_size)

{
  BitStreamReader *this_00;
  bool bVar1;
  uint8_t uVar2;
  uint uVar3;
  PictureCodingType PVar4;
  uint8_t *puVar5;
  
  this_00 = &this->bitReader;
  BitStreamReader::setBuffer(this_00,buf,buf + buf_size);
  uVar3 = BitStreamReader::getBits(this_00,10);
  *(short *)&(this->super_MPEGRawDataHeader).field_0x1c = (short)uVar3;
  PVar4 = BitStreamReader::getBits(this_00,3);
  this->pict_type = PVar4;
  if ((PVar4 & ~D_FRAME) == FORBIDDEN) {
    puVar5 = (uint8_t *)0x0;
  }
  else {
    uVar3 = BitStreamReader::getBits(this_00,0x10);
    this->vbv_delay = (uint16_t)uVar3;
    if ((this->pict_type & ~I_FRAME) == P_FRAME) {
      bVar1 = BitStreamReader::getBit(this_00);
      this->full_pel[0] = (uint)bVar1;
      uVar3 = BitStreamReader::getBits(this_00,3);
      uVar2 = (uint8_t)uVar3;
      this->f_code = uVar2;
      this->mpeg_f_code[0][0] = uVar2;
      this->mpeg_f_code[0][1] = uVar2;
      if (this->pict_type == B_FRAME) {
        bVar1 = BitStreamReader::getBit(this_00);
        this->full_pel[1] = (uint)bVar1;
        uVar3 = BitStreamReader::getBits(this_00,3);
        uVar2 = (uint8_t)uVar3;
        this->f_code = uVar2;
        this->mpeg_f_code[1][0] = uVar2;
        this->mpeg_f_code[1][1] = uVar2;
      }
    }
    puVar5 = MPEGHeader::skipProcessedBytes(this_00);
    this->m_headerSize = (int)puVar5 - (int)buf;
  }
  return puVar5;
}

Assistant:

uint8_t* MPEGPictureHeader::deserialize(uint8_t* buf, const int64_t buf_size)
{
    bitReader.setBuffer(buf, buf + buf_size);

    ref = bitReader.getBits<int16_t>(10); /* temporal ref */
    pict_type = static_cast<PictureCodingType>(bitReader.getBits(3));
    if (pict_type == PictureCodingType::FORBIDDEN || pict_type == PictureCodingType::D_FRAME)
        return nullptr;

    vbv_delay = bitReader.getBits<int16_t>(16);

    if (pict_type == PictureCodingType::P_FRAME || pict_type == PictureCodingType::B_FRAME)
    {
        full_pel[0] = bitReader.getBit();
        f_code = bitReader.getBits<uint8_t>(3);
        mpeg_f_code[0][0] = f_code;
        mpeg_f_code[0][1] = f_code;
    }
    if (pict_type == PictureCodingType::B_FRAME)
    {
        full_pel[1] = bitReader.getBit();
        f_code = bitReader.getBits<uint8_t>(3);
        mpeg_f_code[1][0] = f_code;
        mpeg_f_code[1][1] = f_code;
    }
    uint8_t* new_buff = skipProcessedBytes(bitReader);
    m_headerSize = static_cast<int>(new_buff - buf);
    return new_buff;
}